

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<int>::add_sample(TypedTimeSamples<int> *this,double t,int *v)

{
  undefined1 local_30 [8];
  Sample s;
  int *v_local;
  double t_local;
  TypedTimeSamples<int> *this_local;
  
  s._8_8_ = v;
  Sample::Sample((Sample *)local_30);
  s.t._0_4_ = *(undefined4 *)s._8_8_;
  local_30 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<int>::Sample,std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<int>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<int>::Sample,std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>>
              *)this,(Sample *)local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }